

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  bool bVar1;
  Parse *local_40;
  TriggerPrg *local_38;
  TriggerPrg *pPrg;
  Parse *pRoot;
  int orconf_local;
  Table *pTab_local;
  Trigger *pTrigger_local;
  Parse *pParse_local;
  
  local_40 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_40 = pParse->pToplevel;
  }
  local_38 = local_40->pTriggerPrg;
  while( true ) {
    bVar1 = false;
    if ((local_38 != (TriggerPrg *)0x0) && (bVar1 = true, local_38->pTrigger == pTrigger)) {
      bVar1 = local_38->orconf != orconf;
    }
    if (!bVar1) break;
    local_38 = local_38->pNext;
  }
  if (local_38 == (TriggerPrg *)0x0) {
    local_38 = codeRowTrigger(pParse,pTrigger,pTab,orconf);
    pParse->db->errByteOffset = -1;
  }
  return local_38;
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}